

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O1

float_t __thiscall djb::abc::gaf(abc *this,vec3 *wh,vec3 *wi,vec3 *wo)

{
  float fVar1;
  float fVar2;
  float fVar3;
  
  fVar3 = wi->z * wh->z;
  fVar3 = fVar3 / (wi->x * wh->x + wi->y * wh->y + fVar3);
  fVar3 = fVar3 + fVar3;
  fVar2 = wh->z * wo->z;
  fVar1 = 1.0;
  if (fVar3 <= 1.0) {
    fVar1 = fVar3;
  }
  fVar2 = fVar2 / (wh->x * wo->x + wh->y * wo->y + fVar2);
  fVar2 = fVar2 + fVar2;
  fVar3 = 1.0;
  if (fVar2 <= 1.0) {
    fVar3 = fVar2;
  }
  if (fVar3 <= fVar1) {
    fVar1 = fVar3;
  }
  return fVar1;
}

Assistant:

float_t abc::gaf(const vec3 &wh, const vec3 &wi, const vec3 &wo) const
{
	float_t G1i = min((float_t)1, (float_t)2 * (wh.z * wi.z / dot(wh, wi)));
	float_t G1o = min((float_t)1, (float_t)2 * (wh.z * wo.z / dot(wh, wo)));

	return min(G1i, G1o);
}